

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  SectionNode *in_RDI;
  
  ~SectionNode(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~SectionNode() = default;